

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::declaration_t::declaration_t
          (declaration_t *this,attributes_t *attr,string *context)

{
  string *context_local;
  attributes_t *attr_local;
  declaration_t *this_local;
  
  this->_vptr_declaration_t = (_func_int **)&PTR__declaration_t_003b5990;
  attributes_t::attributes_t(&this->_attr,attr);
  std::__cxx11::string::string((string *)&this->_context,(string *)context);
  return;
}

Assistant:

declaration_t::declaration_t(tchecker::parsing::attributes_t const & attr, std::string const & context)
    : _attr(attr), _context(context)
{
}